

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtext.c
# Opt level: O2

_Bool ExportFontAsCode(Font font,char *fileName)

{
  Image image_00;
  Font FVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uchar *__ptr;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  Image image;
  int compDataSize;
  undefined4 uStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  ulong local_148;
  char *local_140;
  char local_138 [240];
  undefined8 local_48;
  undefined8 uStack_40;
  
  FVar1 = font;
  local_48 = 0;
  uStack_40 = 0;
  pcVar6 = GetFileNameWithoutExt(fileName);
  TextToPascal(pcVar6);
  strncpy(local_138,TextToPascal::buffer,0xff);
  pcVar6 = (char *)calloc(0x100000,1);
  memcpy(pcVar6,
         "////////////////////////////////////////////////////////////////////////////////////////\n"
         ,0x59);
  memcpy(pcVar6 + 0x59,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0xb2,
         "// FontAsCode exporter v1.0 - Font data exported as an array of bytes                 //\n"
         ,0x59);
  memcpy(pcVar6 + 0x10b,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0x164,
         "// more info and bugs-report:  github.com/raysan5/raylib                              //\n"
         ,0x59);
  memcpy(pcVar6 + 0x1bd,
         "// feedback and support:       ray[at]raylib.com                                      //\n"
         ,0x59);
  memcpy(pcVar6 + 0x216,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0x26f,
         "// Copyright (c) 2018-2024 Ramon Santamaria (@raysan5)                                //\n"
         ,0x59);
  memcpy(pcVar6 + 0x2c8,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0x321,
         "// ---------------------------------------------------------------------------------- //\n"
         ,0x59);
  memcpy(pcVar6 + 0x37a,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0x3d3,
         "// TODO: Fill the information and license of the exported font here:                  //\n"
         ,0x59);
  memcpy(pcVar6 + 0x42c,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0x485,
         "// Font name:    ....                                                                 //\n"
         ,0x59);
  memcpy(pcVar6 + 0x4de,
         "// Font creator: ....                                                                 //\n"
         ,0x59);
  memcpy(pcVar6 + 0x537,
         "// Font LICENSE: ....                                                                 //\n"
         ,0x59);
  memcpy(pcVar6 + 0x590,
         "//                                                                                    //\n"
         ,0x59);
  memcpy(pcVar6 + 0x5e9,
         "////////////////////////////////////////////////////////////////////////////////////////\n\n"
         ,0x5b);
  local_158 = font.texture.format;
  compDataSize = font.texture.id;
  uStack_164 = font.texture.width;
  iStack_160 = font.texture.height;
  iStack_15c = font.texture.mipmaps;
  LoadImageFromTexture(FVar1.texture);
  local_140 = fileName;
  if (image.format == 2) {
    iVar3 = 2;
  }
  else {
    TraceLog(4,"Font export as code: Font image format is not GRAY+ALPHA!");
    iVar3 = image.format;
  }
  iVar3 = GetPixelDataSize(image.width,image.height,iVar3);
  _compDataSize = _compDataSize & 0xffffffff00000000;
  __ptr = CompressData((uchar *)image.data,iVar3,&compDataSize);
  TextToUpper(local_138);
  iVar3 = sprintf(pcVar6 + 0x643,"#define COMPRESSED_DATA_SIZE_FONT_%s %i\n\n",TextToUpper::buffer,
                  _compDataSize & 0xffffffff);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x643,"// Font image pi",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x653,"xels data compre",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x662,"essed (DEFLATE)\n",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x672,"// NOTE: Origina",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x682,"l pixel data sim",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x692,"plified to GRAYS",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x6a0,"YSCALE\n",8);
  TextToUpper(local_138);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 0x6a7,
                  "static unsigned char fontData_%s[COMPRESSED_DATA_SIZE_FONT_%s] = { ",local_138,
                  TextToUpper::buffer);
  iVar3 = iVar3 + iVar4 + 0x6a7;
  uVar8 = 0;
  while( true ) {
    if ((long)compDataSize + -1 <= (long)uVar8) break;
    pcVar7 = "0x%02x,\n    ";
    if ((int)((uVar8 & 0xffffffff) / 0x14) * -0x14 + (int)uVar8 != 0) {
      pcVar7 = "0x%02x, ";
    }
    iVar4 = sprintf(pcVar6 + iVar3,pcVar7,(ulong)__ptr[uVar8]);
    iVar3 = iVar3 + iVar4;
    uVar8 = uVar8 + 1;
  }
  lVar9 = 0;
  iVar4 = sprintf(pcVar6 + iVar3,"0x%02x };\n\n",(ulong)__ptr[(long)compDataSize + -1]);
  iVar4 = iVar4 + iVar3;
  free(__ptr);
  builtin_strncpy(pcVar6 + (long)iVar4 + 0x10,"rs rectangles da",0x10);
  builtin_strncpy(pcVar6 + iVar4,"// Font characte",0x10);
  builtin_strncpy(pcVar6 + (long)iVar4 + 0x20,"ta\n",4);
  iVar3 = sprintf(pcVar6 + (long)iVar4 + 0x23,"static Rectangle fontRecs_%s[%i] = {\n",local_138,
                  (ulong)(uint)font.glyphCount);
  iVar3 = iVar4 + iVar3 + 0x23;
  local_148 = 0;
  if (0 < font.glyphCount) {
    local_148 = (ulong)(uint)font.glyphCount;
  }
  lVar10 = local_148 * 0x10;
  while( true ) {
    if (lVar10 == lVar9) break;
    iVar4 = sprintf(pcVar6 + iVar3,"    { %1.0f, %1.0f, %1.0f , %1.0f },\n",
                    SUB84((double)*(float *)((long)&(font.recs)->x + lVar9),0),
                    (double)*(float *)((long)&(font.recs)->y + lVar9),
                    (double)*(float *)((long)&(font.recs)->width + lVar9),
                    (double)*(float *)((long)&(font.recs)->height + lVar9));
    iVar3 = iVar3 + iVar4;
    lVar9 = lVar9 + 0x10;
  }
  builtin_strncpy(pcVar6 + iVar3,
                  "};\n\n// Font glyphs info data\n// NOTE: No glyphs.image data provided\n",0x45);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 0x44,"static GlyphInfo fontGlyphs_%s[%i] = {\n",local_138,
                  (ulong)(uint)font.glyphCount);
  iVar3 = iVar3 + iVar4 + 0x44;
  lVar9 = local_148 * 0x28;
  lVar10 = 0;
  while( true ) {
    if (lVar9 - lVar10 == 0) break;
    iVar4 = sprintf(pcVar6 + iVar3,"    { %i, %i, %i, %i, { 0 }},\n",
                    (ulong)*(uint *)((long)&(font.glyphs)->value + lVar10),
                    (ulong)*(uint *)((long)&(font.glyphs)->offsetX + lVar10),
                    (ulong)*(uint *)((long)&(font.glyphs)->offsetY + lVar10),
                    (ulong)*(uint *)((long)&(font.glyphs)->advanceX + lVar10));
    iVar3 = iVar3 + iVar4;
    lVar10 = lVar10 + 0x28;
  }
  builtin_strncpy(pcVar6 + iVar3,"};\n\n",5);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 4,"// Font loading function: %s\n",local_138);
  iVar5 = sprintf(pcVar6 + (iVar4 + iVar3 + 4),"static Font LoadFont_%s(void)\n{\n",local_138);
  iVar3 = iVar5 + iVar3 + iVar4 + 4;
  builtin_strncpy(pcVar6 + iVar3,"    Font font = ",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 9,"font = { 0 };\n\n",0x10);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 0x18,"    font.baseSize = %i;\n",(ulong)(uint)font.baseSize
                 );
  iVar5 = sprintf(pcVar6 + (iVar4 + iVar3 + 0x18),"    font.glyphCount = %i;\n",
                  (ulong)(uint)font.glyphCount);
  iVar3 = iVar5 + iVar3 + iVar4 + 0x18;
  iVar4 = sprintf(pcVar6 + iVar3,"    font.glyphPadding = %i;\n\n",(ulong)(uint)font.glyphPadding);
  iVar3 = iVar3 + iVar4;
  builtin_strncpy(pcVar6 + iVar3,"    // Custom fo",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xb,"om font loading\n",0x10);
  memcpy(pcVar6 + (long)iVar3 + 0x1b,
         "    // NOTE: Compressed font image data (DEFLATE), it requires DecompressData() function\n"
         ,0x5a);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 0x74,"    int fontDataSize_%s = 0;\n",local_138);
  TextToUpper(local_138);
  iVar5 = sprintf(pcVar6 + (iVar4 + iVar3 + 0x74),
                  "    unsigned char *data = DecompressData(fontData_%s, COMPRESSED_DATA_SIZE_FONT_%s, &fontDataSize_%s);\n"
                  ,local_138,TextToUpper::buffer,local_138);
  iVar3 = iVar5 + iVar3 + iVar4 + 0x74;
  iVar4 = sprintf(pcVar6 + iVar3,"    Image imFont = { data, %i, %i, 1, %i };\n\n",
                  (ulong)(uint)image.width,(ulong)(uint)image.height,(ulong)(uint)image.format);
  iVar3 = iVar3 + iVar4;
  builtin_strncpy(pcVar6 + iVar3,"    // Load text",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xf,"ture from image\n",0x10);
  memcpy(pcVar6 + (long)iVar3 + 0x1f,
         "    if (isGpuReady) font.texture = LoadTextureFromImage(imFont);\n",0x41);
  memcpy(pcVar6 + (long)iVar3 + 0x60,
         "    UnloadImage(imFont);  // Uncompressed data can be unloaded from memory\n\n",0x4c);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xac,"    // Assign gl",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xbc,"yph recs and inf",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xcc,"o data directly\n",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0x109,"loaded\n",8);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xdc,"    // WARNING: ",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xec,"This font data m",0x10);
  builtin_strncpy(pcVar6 + (long)iVar3 + 0xfc,"ust not be unloa",0x10);
  iVar4 = sprintf(pcVar6 + (long)iVar3 + 0x110,"    font.recs = fontRecs_%s;\n",local_138);
  iVar5 = sprintf(pcVar6 + (iVar4 + iVar3 + 0x110),"    font.glyphs = fontGlyphs_%s;\n\n",local_138)
  ;
  builtin_strncpy(pcVar6 + (iVar5 + iVar3 + iVar4 + 0x110),"    return font;\n}\n",0x14);
  image_00.height = image.height;
  image_00.width = image.width;
  image_00.data = image.data;
  image_00.mipmaps = image.mipmaps;
  image_00.format = image.format;
  UnloadImage(image_00);
  pcVar7 = local_140;
  _Var2 = SaveFileText(local_140,pcVar6);
  free(pcVar6);
  if (_Var2) {
    pcVar6 = "FILEIO: [%s] Font as code exported successfully";
    iVar3 = 3;
  }
  else {
    pcVar6 = "FILEIO: [%s] Failed to export font as code";
    iVar3 = 4;
  }
  TraceLog(iVar3,pcVar6,pcVar7);
  return _Var2;
}

Assistant:

bool ExportFontAsCode(Font font, const char *fileName)
{
    bool success = false;

#ifndef TEXT_BYTES_PER_LINE
    #define TEXT_BYTES_PER_LINE     20
#endif

    #define MAX_FONT_DATA_SIZE      1024*1024       // 1 MB

    // Get file name from path
    char fileNamePascal[256] = { 0 };
    strncpy(fileNamePascal, TextToPascal(GetFileNameWithoutExt(fileName)), 256 - 1);

    // NOTE: Text data buffer size is estimated considering image data size in bytes
    // and requiring 6 char bytes for every byte: "0x00, "
    char *txtData = (char *)RL_CALLOC(MAX_FONT_DATA_SIZE, sizeof(char));

    int byteCount = 0;
    byteCount += sprintf(txtData + byteCount, "////////////////////////////////////////////////////////////////////////////////////////\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// FontAsCode exporter v1.0 - Font data exported as an array of bytes                 //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// more info and bugs-report:  github.com/raysan5/raylib                              //\n");
    byteCount += sprintf(txtData + byteCount, "// feedback and support:       ray[at]raylib.com                                      //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// Copyright (c) 2018-2024 Ramon Santamaria (@raysan5)                                //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// ---------------------------------------------------------------------------------- //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// TODO: Fill the information and license of the exported font here:                  //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "// Font name:    ....                                                                 //\n");
    byteCount += sprintf(txtData + byteCount, "// Font creator: ....                                                                 //\n");
    byteCount += sprintf(txtData + byteCount, "// Font LICENSE: ....                                                                 //\n");
    byteCount += sprintf(txtData + byteCount, "//                                                                                    //\n");
    byteCount += sprintf(txtData + byteCount, "////////////////////////////////////////////////////////////////////////////////////////\n\n");

    // Support font export and initialization
    // NOTE: This mechanism is highly coupled to raylib
    Image image = LoadImageFromTexture(font.texture);
    if (image.format != PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA) TRACELOG(LOG_WARNING, "Font export as code: Font image format is not GRAY+ALPHA!");
    int imageDataSize = GetPixelDataSize(image.width, image.height, image.format);

    // Image data is usually GRAYSCALE + ALPHA and can be reduced to GRAYSCALE
    //ImageFormat(&image, PIXELFORMAT_UNCOMPRESSED_GRAYSCALE);

#define SUPPORT_COMPRESSED_FONT_ATLAS
#if defined(SUPPORT_COMPRESSED_FONT_ATLAS)
    // WARNING: Data is compressed using raylib CompressData() DEFLATE,
    // it requires to be decompressed with raylib DecompressData(), that requires
    // compiling raylib with SUPPORT_COMPRESSION_API config flag enabled

    // Compress font image data
    int compDataSize = 0;
    unsigned char *compData = CompressData((const unsigned char *)image.data, imageDataSize, &compDataSize);

    // Save font image data (compressed)
    byteCount += sprintf(txtData + byteCount, "#define COMPRESSED_DATA_SIZE_FONT_%s %i\n\n", TextToUpper(fileNamePascal), compDataSize);
    byteCount += sprintf(txtData + byteCount, "// Font image pixels data compressed (DEFLATE)\n");
    byteCount += sprintf(txtData + byteCount, "// NOTE: Original pixel data simplified to GRAYSCALE\n");
    byteCount += sprintf(txtData + byteCount, "static unsigned char fontData_%s[COMPRESSED_DATA_SIZE_FONT_%s] = { ", fileNamePascal, TextToUpper(fileNamePascal));
    for (int i = 0; i < compDataSize - 1; i++) byteCount += sprintf(txtData + byteCount, ((i%TEXT_BYTES_PER_LINE == 0)? "0x%02x,\n    " : "0x%02x, "), compData[i]);
    byteCount += sprintf(txtData + byteCount, "0x%02x };\n\n", compData[compDataSize - 1]);
    RL_FREE(compData);
#else
    // Save font image data (uncompressed)
    byteCount += sprintf(txtData + byteCount, "// Font image pixels data\n");
    byteCount += sprintf(txtData + byteCount, "// NOTE: 2 bytes per pixel, GRAY + ALPHA channels\n");
    byteCount += sprintf(txtData + byteCount, "static unsigned char fontImageData_%s[%i] = { ", fileNamePascal, imageDataSize);
    for (int i = 0; i < imageDataSize - 1; i++) byteCount += sprintf(txtData + byteCount, ((i%TEXT_BYTES_PER_LINE == 0)? "0x%02x,\n    " : "0x%02x, "), ((unsigned char *)imFont.data)[i]);
    byteCount += sprintf(txtData + byteCount, "0x%02x };\n\n", ((unsigned char *)imFont.data)[imageDataSize - 1]);
#endif

    // Save font recs data
    byteCount += sprintf(txtData + byteCount, "// Font characters rectangles data\n");
    byteCount += sprintf(txtData + byteCount, "static Rectangle fontRecs_%s[%i] = {\n", fileNamePascal, font.glyphCount);
    for (int i = 0; i < font.glyphCount; i++)
    {
        byteCount += sprintf(txtData + byteCount, "    { %1.0f, %1.0f, %1.0f , %1.0f },\n", font.recs[i].x, font.recs[i].y, font.recs[i].width, font.recs[i].height);
    }
    byteCount += sprintf(txtData + byteCount, "};\n\n");

    // Save font glyphs data
    // NOTE: Glyphs image data not saved (grayscale pixels),
    // it could be generated from image and recs
    byteCount += sprintf(txtData + byteCount, "// Font glyphs info data\n");
    byteCount += sprintf(txtData + byteCount, "// NOTE: No glyphs.image data provided\n");
    byteCount += sprintf(txtData + byteCount, "static GlyphInfo fontGlyphs_%s[%i] = {\n", fileNamePascal, font.glyphCount);
    for (int i = 0; i < font.glyphCount; i++)
    {
        byteCount += sprintf(txtData + byteCount, "    { %i, %i, %i, %i, { 0 }},\n", font.glyphs[i].value, font.glyphs[i].offsetX, font.glyphs[i].offsetY, font.glyphs[i].advanceX);
    }
    byteCount += sprintf(txtData + byteCount, "};\n\n");

    // Custom font loading function
    byteCount += sprintf(txtData + byteCount, "// Font loading function: %s\n", fileNamePascal);
    byteCount += sprintf(txtData + byteCount, "static Font LoadFont_%s(void)\n{\n", fileNamePascal);
    byteCount += sprintf(txtData + byteCount, "    Font font = { 0 };\n\n");
    byteCount += sprintf(txtData + byteCount, "    font.baseSize = %i;\n", font.baseSize);
    byteCount += sprintf(txtData + byteCount, "    font.glyphCount = %i;\n", font.glyphCount);
    byteCount += sprintf(txtData + byteCount, "    font.glyphPadding = %i;\n\n", font.glyphPadding);
    byteCount += sprintf(txtData + byteCount, "    // Custom font loading\n");
#if defined(SUPPORT_COMPRESSED_FONT_ATLAS)
    byteCount += sprintf(txtData + byteCount, "    // NOTE: Compressed font image data (DEFLATE), it requires DecompressData() function\n");
    byteCount += sprintf(txtData + byteCount, "    int fontDataSize_%s = 0;\n", fileNamePascal);
    byteCount += sprintf(txtData + byteCount, "    unsigned char *data = DecompressData(fontData_%s, COMPRESSED_DATA_SIZE_FONT_%s, &fontDataSize_%s);\n", fileNamePascal, TextToUpper(fileNamePascal), fileNamePascal);
    byteCount += sprintf(txtData + byteCount, "    Image imFont = { data, %i, %i, 1, %i };\n\n", image.width, image.height, image.format);
#else
    byteCount += sprintf(txtData + byteCount, "    Image imFont = { fontImageData_%s, %i, %i, 1, %i };\n\n", styleName, image.width, image.height, image.format);
#endif
    byteCount += sprintf(txtData + byteCount, "    // Load texture from image\n");
    byteCount += sprintf(txtData + byteCount, "    if (isGpuReady) font.texture = LoadTextureFromImage(imFont);\n");
#if defined(SUPPORT_COMPRESSED_FONT_ATLAS)
    byteCount += sprintf(txtData + byteCount, "    UnloadImage(imFont);  // Uncompressed data can be unloaded from memory\n\n");
#endif
    // We have two possible mechanisms to assign font.recs and font.glyphs data,
    // that data is already available as global arrays, we two options to assign that data:
    //  - 1. Data copy. This option consumes more memory and Font MUST be unloaded by user, requiring additional code
    //  - 2. Data assignment. This option consumes less memory and Font MUST NOT be unloaded by user because data is on protected DATA segment
//#define SUPPORT_FONT_DATA_COPY
#if defined(SUPPORT_FONT_DATA_COPY)
    byteCount += sprintf(txtData + byteCount, "    // Copy glyph recs data from global fontRecs\n");
    byteCount += sprintf(txtData + byteCount, "    // NOTE: Required to avoid issues if trying to free font\n");
    byteCount += sprintf(txtData + byteCount, "    font.recs = (Rectangle *)malloc(font.glyphCount*sizeof(Rectangle));\n");
    byteCount += sprintf(txtData + byteCount, "    memcpy(font.recs, fontRecs_%s, font.glyphCount*sizeof(Rectangle));\n\n", fileNamePascal);

    byteCount += sprintf(txtData + byteCount, "    // Copy font glyph info data from global fontChars\n");
    byteCount += sprintf(txtData + byteCount, "    // NOTE: Required to avoid issues if trying to free font\n");
    byteCount += sprintf(txtData + byteCount, "    font.glyphs = (GlyphInfo *)malloc(font.glyphCount*sizeof(GlyphInfo));\n");
    byteCount += sprintf(txtData + byteCount, "    memcpy(font.glyphs, fontGlyphs_%s, font.glyphCount*sizeof(GlyphInfo));\n\n", fileNamePascal);
#else
    byteCount += sprintf(txtData + byteCount, "    // Assign glyph recs and info data directly\n");
    byteCount += sprintf(txtData + byteCount, "    // WARNING: This font data must not be unloaded\n");
    byteCount += sprintf(txtData + byteCount, "    font.recs = fontRecs_%s;\n", fileNamePascal);
    byteCount += sprintf(txtData + byteCount, "    font.glyphs = fontGlyphs_%s;\n\n", fileNamePascal);
#endif
    byteCount += sprintf(txtData + byteCount, "    return font;\n");
    byteCount += sprintf(txtData + byteCount, "}\n");

    UnloadImage(image);

    // NOTE: Text data size exported is determined by '\0' (NULL) character
    success = SaveFileText(fileName, txtData);

    RL_FREE(txtData);

    if (success != 0) TRACELOG(LOG_INFO, "FILEIO: [%s] Font as code exported successfully", fileName);
    else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to export font as code", fileName);

    return success;
}